

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

Value * __thiscall cmGlobalGenerator::GetJson(Value *__return_storage_ptr__,cmGlobalGenerator *this)

{
  Value *this_00;
  string local_68;
  Value local_48;
  undefined1 local_19;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *this_local;
  Value *generator;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  (*this->_vptr_cmGlobalGenerator[3])(&local_68);
  Json::Value::Value(&local_48,&local_68);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(this_00,&local_48);
  Json::Value::~Value(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmGlobalGenerator::GetJson() const
{
  Json::Value generator = Json::objectValue;
  generator["name"] = this->GetName();
  return generator;
}